

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

pattern * getPat(char *line,char *which,int verbose)

{
  pattern *pat;
  int verbose_local;
  char *which_local;
  char *line_local;
  
  if (line == (char *)0x0) {
    line_local = (char *)0x0;
  }
  else {
    line_local = (char *)parseArg(line);
    if ((verbose != 0) && ((pattern *)line_local != (pattern *)0x0)) {
      fprintf(_stderr,"%s: ",which);
      printPattern((FILE *)_stderr,(pattern *)line_local);
    }
  }
  return (pattern *)line_local;
}

Assistant:

pattern* getPat(char *line, char *which, int verbose)
{
   pattern *pat;

   if (!line) return NULL;

   pat = parseArg(line);  /* parse.c/parseArg() */

   if (verbose && pat) {
      fprintf(stderr, "%s: ", which);
      printPattern(stderr, pat); /* parse.c/printPattern() */
   }

   return pat;
}